

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alSource3i(ALuint name,ALenum param,ALint value1,ALint value2,ALint value3)

{
  anon_union_4_2_32316eff cvt_2;
  anon_union_4_2_32316eff cvt_1;
  anon_union_4_2_32316eff cvt;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSource3i);
  writele32(name);
  writele32(param);
  writele32(value1);
  writele32(value2);
  writele32(value3);
  (*REAL_alSource3i)(name,param,value1,value2,value3);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSource3i(ALuint name, ALenum param, ALint value1, ALint value2, ALint value3)
{
    IO_START(alSource3i);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_INT32(value1);
    IO_INT32(value2);
    IO_INT32(value3);
    REAL_alSource3i(name, param, value1, value2, value3);
    check_source_state_from_name(name);
    IO_END();
}